

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  value_type vVar2;
  AssertHelper *this_00;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  key_type *in_stack_fffffffffffffca8;
  int iVar3;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  allocator_type *in_stack_fffffffffffffcc0;
  key_equal *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  key_type in_stack_fffffffffffffcd4;
  char *in_stack_fffffffffffffcd8;
  Type type;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffce0;
  Message *in_stack_fffffffffffffd28;
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd30;
  AssertionResult local_288 [3];
  value_type local_24c;
  key_equal *local_238;
  AssertionResult local_230;
  key_type local_220;
  int local_21c;
  AssertHelper *local_208;
  AssertionResult local_200 [3];
  value_type local_1c8;
  int local_1c4;
  size_type local_1b0;
  AssertionResult local_1a8;
  key_type local_194;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_190 [11];
  int local_d8;
  int local_d4;
  AssertionResult local_d0 [3];
  value_type local_98;
  key_type local_94;
  int local_90;
  int local_8c;
  size_type local_68;
  AssertionResult local_60 [3];
  value_type local_24;
  int local_20;
  key_type local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            ((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)in_stack_fffffffffffffcb0,(float)((ulong)in_stack_fffffffffffffca8 >> 0x20),
             SUB84(in_stack_fffffffffffffca8,0));
  local_1c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  for (local_20 = 0; local_20 < 0x333; local_20 = local_20 + 1) {
    local_24 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffcb0,
                              (int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
  }
  local_68 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x1020f7e);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (unsigned_long *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1020fe5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffce0,
               (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x1021048);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10210b9);
  local_8c = google::
             HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::num_table_copies((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                 *)(in_RDI + 0x10));
  for (local_90 = 0; local_90 < 0x400; local_90 = local_90 + 1) {
    in_stack_fffffffffffffd30 =
         (BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)(in_RDI + 0x10);
    local_94 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    local_98 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffcb0,
                              (int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
  }
  local_d4 = google::
             HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::num_table_copies((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                 *)(in_RDI + 0x10));
  local_d8 = local_8c + 2;
  testing::internal::CmpHelperLT<int,int>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (int *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (int *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0);
    in_stack_fffffffffffffd28 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x102121f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffce0,
               (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x1021282);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10212f3);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffcb0,
             (int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffcb0,
             (int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_190,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8,
             (hasher *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_190);
  local_194 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            ((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)in_stack_fffffffffffffcb0,(float)((ulong)in_stack_fffffffffffffca8 >> 0x20),
             SUB84(in_stack_fffffffffffffca8,0));
  local_1b0 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x10213cf);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (unsigned_long *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1021495);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffce0,
               (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x10214f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1021563);
  for (local_1c4 = 0; local_1c4 < 0x333; local_1c4 = local_1c4 + 1) {
    local_1c8 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffcb0,
                               (int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
  }
  this_00 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x10215f5);
  local_208 = this_00;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (unsigned_long *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffcd8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x102166a);
    testing::internal::AssertHelper::AssertHelper
              (this_00,(Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x10216c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1021738);
  local_21c = 0;
  while( true ) {
    type = (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
    iVar3 = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
    if (0x332 < local_21c) break;
    in_stack_fffffffffffffcd4 =
         HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffcb0,iVar3);
    local_220 = in_stack_fffffffffffffcd4;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    in_stack_fffffffffffffcc8 =
         (key_equal *)
         google::
         BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0x102179f);
    local_238 = in_stack_fffffffffffffcc8;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
               (unsigned_long *)in_stack_fffffffffffffcb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffcc0 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x1021826)
      ;
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(char *)in_stack_fffffffffffffcc0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
      testing::Message::~Message((Message *)0x1021883);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10218ee);
    local_21c = local_21c + 1;
  }
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffffcb0,iVar3);
  local_24c = vVar2;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x1021965);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (unsigned_long *)CONCAT44(vVar2,in_stack_fffffffffffffcb8),(unsigned_long *)this_01);
  iVar3 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_288);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x10219da);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               iVar3,(char *)in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x1021a35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1021aa0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0x1021aad);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}